

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamHttp_p.cpp
# Opt level: O2

bool __thiscall BamTools::Internal::BamHttp::ReceiveResponse(BamHttp *this)

{
  bool bVar1;
  long lVar2;
  HttpResponseHeader *this_00;
  bool bVar3;
  allocator local_8a;
  allocator local_89;
  string headerLine;
  string local_68;
  string responseHeader;
  
  responseHeader._M_dataplus._M_p = (pointer)&responseHeader.field_2;
  responseHeader._M_string_length = 0;
  responseHeader.field_2._M_local_buf[0] = '\0';
  do {
    bVar1 = TcpSocket::WaitForReadLine(this->m_socket);
    if (!bVar1) goto LAB_001be0b8;
    TcpSocket::ReadLine_abi_cxx11_(&headerLine,this->m_socket,0);
    std::__cxx11::string::append((string *)&responseHeader);
    std::__cxx11::string::~string((string *)&headerLine);
    lVar2 = std::__cxx11::string::find((string *)&responseHeader,0x1febd8);
  } while (lVar2 != responseHeader._M_string_length - DOUBLE_NEWLINE_abi_cxx11_._8_8_);
  if (responseHeader._M_string_length == 0) {
    std::__cxx11::string::string((string *)&headerLine,"BamHttp::ReceiveResponse",&local_89);
    std::__cxx11::string::string((string *)&local_68,"empty HTTP response",&local_8a);
    IBamIODevice::SetErrorString(&this->super_IBamIODevice,&headerLine,&local_68);
  }
  else {
    this_00 = (HttpResponseHeader *)operator_new(0x68);
    HttpResponseHeader::HttpResponseHeader(this_00,&responseHeader);
    this->m_response = this_00;
    bVar1 = HttpHeader::IsValid((HttpHeader *)this_00);
    bVar3 = true;
    if (bVar1) goto LAB_001be0ba;
    std::__cxx11::string::string((string *)&headerLine,"BamHttp::ReceiveResponse",&local_89);
    std::__cxx11::string::string((string *)&local_68,"could not parse HTTP response",&local_8a);
    IBamIODevice::SetErrorString(&this->super_IBamIODevice,&headerLine,&local_68);
  }
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&headerLine);
  (*(this->super_IBamIODevice)._vptr_IBamIODevice[2])(this);
LAB_001be0b8:
  bVar3 = false;
LAB_001be0ba:
  std::__cxx11::string::~string((string *)&responseHeader);
  return bVar3;
}

Assistant:

bool BamHttp::ReceiveResponse()
{

    // fetch header, up until double new line
    std::string responseHeader;
    do {

        // make sure we can read a line
        if (!m_socket->WaitForReadLine()) return false;

        // read line & append to full header
        const std::string headerLine = m_socket->ReadLine();
        responseHeader += headerLine;

    } while (!endsWith(responseHeader, DOUBLE_NEWLINE));

    // sanity check
    if (responseHeader.empty()) {
        SetErrorString("BamHttp::ReceiveResponse", "empty HTTP response");
        Close();
        return false;
    }

    // create response from header text
    m_response = new HttpResponseHeader(responseHeader);
    if (!m_response->IsValid()) {
        SetErrorString("BamHttp::ReceiveResponse", "could not parse HTTP response");
        Close();
        return false;
    }

    // if we get here, success
    return true;
}